

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::coordinateBindingTest<false>(ViewTest *this)

{
  undefined8 uVar1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var2;
  reference piVar3;
  size_t sVar4;
  size_t sVar5;
  logic_error *plVar6;
  int iVar7;
  code *pcVar8;
  int iVar9;
  value_type *__val_4;
  undefined *puVar10;
  int *piVar11;
  size_t sVar12;
  long lVar13;
  value_type *__val;
  bool bVar14;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  View<int,_false,_std::allocator<unsigned_long>_> w;
  int local_dc;
  int *local_d8;
  undefined1 local_d0 [16];
  size_t *local_c0;
  size_t local_a8;
  size_t local_a0;
  unsigned_long *local_90;
  View<int,_false,_std::allocator<unsigned_long>_> local_88;
  uint local_44;
  unsigned_long *local_40;
  ulong local_38;
  
  _Var2._M_current = (unsigned_long *)operator_new(8);
  *_Var2._M_current = 0x18;
  local_d8 = this->data_;
  local_d0._0_8_ = local_d8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),_Var2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var2._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_88);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d0,0,7);
  if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
    pcVar8 = std::runtime_error::~runtime_error;
    puVar10 = &std::runtime_error::typeinfo;
LAB_001a55fb:
    __cxa_throw(plVar6,puVar10,pcVar8);
  }
  if ((local_88.geometry_.dimension_ != 0) || (local_88.geometry_.size_ != 1)) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    pcVar8 = std::logic_error::~logic_error;
    puVar10 = &std::logic_error::typeinfo;
    goto LAB_001a55fb;
  }
  local_dc = 0;
  piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_dc);
  if (*piVar3 != 7) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
  operator_delete(local_c0,local_a8 * 0x18);
  operator_delete(_Var2._M_current,8);
  _Var2._M_current = (unsigned_long *)operator_new(0x10);
  *_Var2._M_current = 0;
  _Var2._M_current[1] = 0;
  *_Var2._M_current = 6;
  _Var2._M_current[1] = 4;
  local_d0._0_8_ = local_d8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),_Var2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var2._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_88);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d0,0,3);
  if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
    pcVar8 = std::runtime_error::~runtime_error;
    puVar10 = &std::runtime_error::typeinfo;
LAB_001a568b:
    __cxa_throw(plVar6,puVar10,pcVar8);
  }
  if ((local_88.geometry_.dimension_ != 1) || (local_88.geometry_.size_ != 4)) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    pcVar8 = std::logic_error::~logic_error;
    puVar10 = &std::logic_error::typeinfo;
    goto LAB_001a568b;
  }
  local_dc = 0;
  piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_dc);
  if (*piVar3 != 3) {
LAB_001a536b:
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_dc = 1;
  piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_dc);
  if (*piVar3 != 9) goto LAB_001a536b;
  local_dc = 2;
  piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_dc);
  if (*piVar3 != 0xf) goto LAB_001a536b;
  local_dc = 3;
  piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_dc);
  if (*piVar3 != 0x15) goto LAB_001a536b;
  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
  operator_delete(local_c0,local_a8 * 0x18);
  operator_delete(_Var2._M_current,0x10);
  _Var2._M_current = (unsigned_long *)operator_new(0x10);
  *_Var2._M_current = 0;
  _Var2._M_current[1] = 0;
  *_Var2._M_current = 6;
  _Var2._M_current[1] = 4;
  local_88.data_._0_4_ = 0;
  local_d0._0_8_ = local_d8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),_Var2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var2._M_current + 2),(CoordinateOrder *)&local_88,&andres::defaultOrder,
             (allocator_type *)&local_dc);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d0,0,3);
  if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
    pcVar8 = std::runtime_error::~runtime_error;
    puVar10 = &std::runtime_error::typeinfo;
LAB_001a56e9:
    __cxa_throw(plVar6,puVar10,pcVar8);
  }
  if ((local_88.geometry_.dimension_ != 1) || (local_88.geometry_.size_ != 4)) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    pcVar8 = std::logic_error::~logic_error;
    puVar10 = &std::logic_error::typeinfo;
    goto LAB_001a56e9;
  }
  local_dc = 0;
  piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_dc);
  if (*piVar3 != 0xc) {
LAB_001a539d:
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_dc = 1;
  piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_dc);
  if (*piVar3 != 0xd) goto LAB_001a539d;
  local_dc = 2;
  piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_dc);
  if (*piVar3 != 0xe) goto LAB_001a539d;
  local_dc = 3;
  piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
           execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_dc);
  if (*piVar3 != 0xf) goto LAB_001a539d;
  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
  operator_delete(local_c0,local_a8 * 0x18);
  operator_delete(_Var2._M_current,0x10);
  _Var2._M_current = (unsigned_long *)operator_new(0x10);
  *_Var2._M_current = 0;
  _Var2._M_current[1] = 0;
  *_Var2._M_current = 6;
  _Var2._M_current[1] = 4;
  local_d0._0_8_ = local_d8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),_Var2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var2._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_88);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d0,1,2);
  if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
    pcVar8 = std::runtime_error::~runtime_error;
    puVar10 = &std::runtime_error::typeinfo;
LAB_001a5747:
    __cxa_throw(plVar6,puVar10,pcVar8);
  }
  if ((local_88.geometry_.dimension_ != 1) || (local_88.geometry_.size_ != 6)) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    pcVar8 = std::logic_error::~logic_error;
    puVar10 = &std::logic_error::typeinfo;
    goto LAB_001a5747;
  }
  lVar13 = 0;
  do {
    local_dc = (int)lVar13;
    piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
             execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_dc);
    if (*piVar3 != this->data_[lVar13 + 0xc]) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"test failed.");
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    lVar13 = lVar13 + 1;
  } while ((int)lVar13 != 6);
  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
  operator_delete(local_c0,local_a8 * 0x18);
  operator_delete(_Var2._M_current,0x10);
  _Var2._M_current = (unsigned_long *)operator_new(0x10);
  *_Var2._M_current = 0;
  _Var2._M_current[1] = 0;
  *_Var2._M_current = 6;
  _Var2._M_current[1] = 4;
  local_88.data_._0_4_ = 0;
  local_d0._0_8_ = local_d8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),_Var2,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var2._M_current + 2),(CoordinateOrder *)&local_88,&andres::defaultOrder,
             (allocator_type *)&local_dc);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d0,1,2);
  if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
    pcVar8 = std::runtime_error::~runtime_error;
    puVar10 = &std::runtime_error::typeinfo;
LAB_001a57a5:
    __cxa_throw(plVar6,puVar10,pcVar8);
  }
  if ((local_88.geometry_.dimension_ != 1) || (local_88.geometry_.size_ != 6)) {
    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar6,"test failed.");
    pcVar8 = std::logic_error::~logic_error;
    puVar10 = &std::logic_error::typeinfo;
    goto LAB_001a57a5;
  }
  piVar11 = &DAT_00232950;
  lVar13 = 0;
  do {
    local_dc = (int)lVar13;
    piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
             execute<int,int,false,std::allocator<unsigned_long>>(&local_88,&local_dc);
    if (*piVar3 != *piVar11) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"test failed.");
      __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    lVar13 = lVar13 + 1;
    piVar11 = piVar11 + 1;
  } while (lVar13 != 6);
  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
  operator_delete(local_c0,local_a8 * 0x18);
  operator_delete(_Var2._M_current,0x10);
  local_90 = (unsigned_long *)operator_new(0x18);
  *local_90 = 0;
  local_90[1] = 0;
  *local_90 = 3;
  local_90[1] = 4;
  local_90[2] = 2;
  local_d0._0_8_ = local_d8;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_90,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(local_90 + 3),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_88);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
            (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d0,0,2);
  if (local_88.geometry_.size_ == 8) {
    if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
      pcVar8 = std::runtime_error::~runtime_error;
      puVar10 = &std::runtime_error::typeinfo;
      goto LAB_001a57d7;
    }
    if (local_88.geometry_.dimension_ == 2) {
      lVar13 = 0;
      iVar7 = 0;
      do {
        iVar9 = (int)lVar13;
        lVar13 = (long)iVar9 + 4;
        sVar12 = 0;
        do {
          piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)&local_88,sVar12,
                              iVar7);
          if (*piVar3 != (&DAT_00232af0)[sVar12 + (long)iVar9]) {
            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar6,"test failed.");
            __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          sVar12 = sVar12 + 1;
        } while (sVar12 != 4);
        bVar14 = iVar7 == 0;
        iVar7 = iVar7 + 1;
      } while (bVar14);
      operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
      operator_delete(local_c0,local_a8 * 0x18);
      operator_delete(local_90,0x18);
      local_90 = (unsigned_long *)operator_new(0x18);
      *local_90 = 0;
      local_90[1] = 0;
      *local_90 = 3;
      local_90[1] = 4;
      local_90[2] = 2;
      local_88.data_._0_4_ = 0;
      local_d0._0_8_ = local_d8;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_90,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(local_90 + 3),(CoordinateOrder *)&local_88,&andres::defaultOrder,
                 (allocator_type *)&local_dc);
      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
      andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
                (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d0,0,2);
      if (local_88.geometry_.size_ == 8) {
        if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
          pcVar8 = std::runtime_error::~runtime_error;
          puVar10 = &std::runtime_error::typeinfo;
          goto LAB_001a5809;
        }
        if (local_88.geometry_.dimension_ == 2) {
          lVar13 = 0;
          iVar7 = 0;
          do {
            iVar9 = (int)lVar13;
            lVar13 = (long)iVar9 + 4;
            sVar12 = 0;
            do {
              piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                 ((View<int,false,std::allocator<unsigned_long>> *)&local_88,sVar12,
                                  iVar7);
              if (*piVar3 != (&DAT_00232b10)[sVar12 + (long)iVar9]) {
                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar6,"test failed.");
                __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              sVar12 = sVar12 + 1;
            } while (sVar12 != 4);
            bVar14 = iVar7 == 0;
            iVar7 = iVar7 + 1;
          } while (bVar14);
          operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
          operator_delete(local_c0,local_a8 * 0x18);
          operator_delete(local_90,0x18);
          local_90 = (unsigned_long *)operator_new(0x18);
          *local_90 = 0;
          local_90[1] = 0;
          *local_90 = 3;
          local_90[1] = 4;
          local_90[2] = 2;
          local_d0._0_8_ = local_d8;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )local_90,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(local_90 + 3),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)&local_88);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
                    (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d0,1,2);
          if (local_88.geometry_.size_ == 6) {
            if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
              pcVar8 = std::runtime_error::~runtime_error;
              puVar10 = &std::runtime_error::typeinfo;
              goto LAB_001a583b;
            }
            if (local_88.geometry_.dimension_ == 2) {
              lVar13 = 0;
              iVar7 = 0;
              do {
                iVar9 = (int)lVar13;
                lVar13 = (long)iVar9 + 3;
                sVar12 = 0;
                do {
                  piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                     ((View<int,false,std::allocator<unsigned_long>> *)&local_88,
                                      sVar12,iVar7);
                  if (*piVar3 != (&DAT_00232970)[sVar12 + (long)iVar9]) {
                    plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar6,"test failed.");
                    __cxa_throw(plVar6,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                  sVar12 = sVar12 + 1;
                } while (sVar12 != 3);
                bVar14 = iVar7 == 0;
                iVar7 = iVar7 + 1;
              } while (bVar14);
              operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
              operator_delete(local_c0,local_a8 * 0x18);
              operator_delete(local_90,0x18);
              local_90 = (unsigned_long *)operator_new(0x18);
              *local_90 = 0;
              local_90[1] = 0;
              *local_90 = 3;
              local_90[1] = 4;
              local_90[2] = 2;
              local_88.data_._0_4_ = 0;
              local_d0._0_8_ = local_d8;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )local_90,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(local_90 + 3),(CoordinateOrder *)&local_88,&andres::defaultOrder,
                         (allocator_type *)&local_dc);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::boundView
                        (&local_88,(View<int,_false,_std::allocator<unsigned_long>_> *)local_d0,1,2)
              ;
              if (local_88.geometry_.size_ == 6) {
                if (CONCAT44(local_88.data_._4_4_,local_88.data_._0_4_) == 0) {
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.");
                  pcVar8 = std::runtime_error::~runtime_error;
                  puVar10 = &std::runtime_error::typeinfo;
                  goto LAB_001a586d;
                }
                if (local_88.geometry_.dimension_ == 2) {
                  lVar13 = 0;
                  iVar7 = 0;
                  do {
                    iVar9 = (int)lVar13;
                    lVar13 = (long)iVar9 + 3;
                    sVar12 = 0;
                    do {
                      piVar3 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                                         ((View<int,false,std::allocator<unsigned_long>> *)&local_88
                                          ,sVar12,iVar7);
                      if (*piVar3 != (&DAT_00232990)[sVar12 + (long)iVar9]) {
                        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar6,"test failed.");
                        __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      sVar12 = sVar12 + 1;
                    } while (sVar12 != 3);
                    bVar14 = iVar7 == 0;
                    iVar7 = iVar7 + 1;
                  } while (bVar14);
                  operator_delete(local_88.geometry_.shape_,local_88.geometry_.dimension_ * 0x18);
                  operator_delete(local_c0,local_a8 * 0x18);
                  operator_delete(local_90,0x18);
                  _Var2._M_current = (unsigned_long *)operator_new(0x10);
                  *_Var2._M_current = 0;
                  _Var2._M_current[1] = 0;
                  *_Var2._M_current = 1;
                  _Var2._M_current[1] = 1;
                  local_d0._0_8_ = local_d8;
                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),_Var2,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(_Var2._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
                             (allocator_type *)&local_88);
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
                  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
                  if (local_a0 == 1) {
                    if ((int *)local_d0._0_8_ == (int *)0x0) {
                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar6,"Assertion failed.")
                      ;
                      pcVar8 = std::runtime_error::~runtime_error;
                      puVar10 = &std::runtime_error::typeinfo;
                      goto LAB_001a589f;
                    }
                    if (local_a8 == 0) {
                      local_88.data_._0_4_ = 0;
                      piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
                               execute<int,int,false,std::allocator<unsigned_long>>
                                         ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                          local_d0,(int *)&local_88);
                      if (*piVar3 != 0) {
                        plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar6,"test failed.");
                        __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      operator_delete(local_c0,local_a8 * 0x18);
                      operator_delete(_Var2._M_current,0x10);
                      _Var2._M_current = (unsigned_long *)operator_new(0x10);
                      *_Var2._M_current = 0;
                      _Var2._M_current[1] = 0;
                      *_Var2._M_current = 0x18;
                      _Var2._M_current[1] = 1;
                      local_d0._0_8_ = local_d8;
                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),_Var2,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )(_Var2._M_current + 2),&andres::defaultOrder,
                                 &andres::defaultOrder,(allocator_type *)&local_88);
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
                      andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
                                ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
                      if (local_a0 == 0x18) {
                        if ((int *)local_d0._0_8_ == (int *)0x0) {
                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar6,"Assertion failed.");
                          pcVar8 = std::runtime_error::~runtime_error;
                          puVar10 = &std::runtime_error::typeinfo;
                          goto LAB_001a5903;
                        }
                        if (local_a8 == 1) {
                          lVar13 = 0;
                          do {
                            local_88.data_._0_4_ = (undefined4)lVar13;
                            piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
                                     execute<int,int,false,std::allocator<unsigned_long>>
                                               ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_d0,(int *)&local_88);
                            if (*piVar3 != local_d8[lVar13]) {
                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar6,"test failed.");
                              __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                          std::logic_error::~logic_error);
                            }
                            lVar13 = lVar13 + 1;
                          } while (lVar13 != 0x18);
                          operator_delete(local_c0,local_a8 * 0x18);
                          operator_delete(_Var2._M_current,0x10);
                          _Var2._M_current = (unsigned_long *)operator_new(0x18);
                          *_Var2._M_current = 0;
                          _Var2._M_current[1] = 0;
                          *_Var2._M_current = 1;
                          _Var2._M_current[1] = 1;
                          _Var2._M_current[2] = 1;
                          local_d0._0_8_ = local_d8;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),_Var2
                                     ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       )(_Var2._M_current + 3),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_88);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
                          andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
                                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_d0);
                          if (local_a0 == 1) {
                            if ((int *)local_d0._0_8_ == (int *)0x0) {
                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar6,"Assertion failed.");
                              pcVar8 = std::runtime_error::~runtime_error;
                              puVar10 = &std::runtime_error::typeinfo;
                              goto LAB_001a5935;
                            }
                            if (local_a8 == 0) {
                              local_88.data_._0_4_ = 0;
                              piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
                                       execute<int,int,false,std::allocator<unsigned_long>>
                                                 ((View<int,_false,_std::allocator<unsigned_long>_>
                                                   *)local_d0,(int *)&local_88);
                              if (*piVar3 != 0) {
                                plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar6,"test failed.");
                                __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                            std::logic_error::~logic_error);
                              }
                              operator_delete(local_c0,local_a8 * 0x18);
                              operator_delete(_Var2._M_current,0x18);
                              _Var2._M_current = (unsigned_long *)operator_new(0x18);
                              *_Var2._M_current = 0;
                              _Var2._M_current[1] = 0;
                              *_Var2._M_current = 1;
                              _Var2._M_current[1] = 0x18;
                              _Var2._M_current[2] = 1;
                              local_d0._0_8_ = local_d8;
                              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Geometry<std::allocator<unsigned_long>> *)(local_d0 + 8),
                                         _Var2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var2._M_current + 3),&andres::defaultOrder,
                                         &andres::defaultOrder,(allocator_type *)&local_88);
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::
                              testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                            local_d0);
                              andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
                                        ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                         local_d0);
                              if (local_a0 == 0x18) {
                                if ((int *)local_d0._0_8_ == (int *)0x0) {
                                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar6,"Assertion failed.");
                                  pcVar8 = std::runtime_error::~runtime_error;
                                  puVar10 = &std::runtime_error::typeinfo;
                                  goto LAB_001a5999;
                                }
                                if (local_a8 == 1) {
                                  lVar13 = 0;
                                  do {
                                    local_88.data_._0_4_ = (undefined4)lVar13;
                                    piVar3 = andres::marray_detail::AccessOperatorHelper<true>::
                                             execute<int,int,false,std::allocator<unsigned_long>>
                                                       ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_d0,(int *)&local_88);
                                    if (*piVar3 != local_d8[lVar13]) {
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar6,"test failed.");
                                      __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                                  std::logic_error::~logic_error);
                                    }
                                    lVar13 = lVar13 + 1;
                                  } while (lVar13 != 0x18);
                                  operator_delete(local_c0,local_a8 * 0x18);
                                  operator_delete(_Var2._M_current,0x18);
                                  _Var2._M_current = (unsigned_long *)operator_new(0x18);
                                  *_Var2._M_current = 0;
                                  _Var2._M_current[1] = 0;
                                  *_Var2._M_current = 1;
                                  _Var2._M_current[1] = 3;
                                  _Var2._M_current[2] = 2;
                                  local_d0._0_8_ = local_d8;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)
                                             (local_d0 + 8),_Var2,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(_Var2._M_current + 3),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)&local_88);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_d0);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::squeeze
                                            ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                             local_d0);
                                  if (local_a0 == 6) {
                                    if ((int *)local_d0._0_8_ == (int *)0x0) {
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                ((runtime_error *)plVar6,"Assertion failed.");
                                      pcVar8 = std::runtime_error::~runtime_error;
                                      puVar10 = &std::runtime_error::typeinfo;
                                      goto LAB_001a59cb;
                                    }
                                    if (local_a8 == 2) {
                                      lVar13 = 0;
                                      iVar7 = 0;
                                      do {
                                        piVar11 = local_d8;
                                        iVar9 = (int)lVar13;
                                        lVar13 = (long)iVar9 + 3;
                                        sVar12 = 0;
                                        do {
                                          piVar3 = andres::
                                                  View<int,false,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,false,std::allocator<unsigned_long>> *)
                                                  local_d0,sVar12,iVar7);
                                          if (*piVar3 != piVar11[(long)iVar9 + sVar12]) {
                                            plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar6,"test failed.");
                                            __cxa_throw(plVar6,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          sVar12 = sVar12 + 1;
                                        } while (sVar12 != 3);
                                        bVar14 = iVar7 == 0;
                                        iVar7 = iVar7 + 1;
                                      } while (bVar14);
                                      operator_delete(local_c0,local_a8 * 0x18);
                                      operator_delete(_Var2._M_current,0x18);
                                      local_40 = (unsigned_long *)operator_new(0x30);
                                      *local_40 = 0;
                                      local_40[1] = 0;
                                      local_40[2] = 0;
                                      local_40[3] = 0;
                                      local_40[4] = 0;
                                      local_40[5] = 0;
                                      *local_40 = 1;
                                      local_40[1] = 2;
                                      local_40[2] = 1;
                                      local_40[3] = 1;
                                      local_40[4] = 3;
                                      local_40[5] = 2;
                                      local_d0._0_8_ = local_d8;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_d0 + 8),
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )local_40,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40 + 6),&andres::defaultOrder,
                                                 &andres::defaultOrder,(allocator_type *)&local_88);
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_d0);
                                      andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                      squeeze((View<int,_false,_std::allocator<unsigned_long>_> *)
                                              local_d0);
                                      if (local_a0 == 0xc) {
                                        if ((int *)local_d0._0_8_ == (int *)0x0) {
                                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar6,"Assertion failed.");
                                          pcVar8 = std::runtime_error::~runtime_error;
                                          puVar10 = &std::runtime_error::typeinfo;
                                          goto LAB_001a59fd;
                                        }
                                        if (local_a8 == 3) {
                                          local_90 = (unsigned_long *)0x0;
                                          local_44 = 0;
                                          do {
                                            local_38 = (ulong)local_44;
                                            local_44 = local_44 + 6;
                                            sVar12 = 0;
                                            do {
                                              piVar11 = local_d8;
                                              iVar7 = (int)local_38;
                                              local_38 = (ulong)(iVar7 + 2);
                                              lVar13 = 0;
                                              do {
                                                andres::
                                                View<int,_false,_std::allocator<unsigned_long>_>::
                                                testInvariant((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_d0);
                                                uVar1 = local_d0._0_8_;
                                                if (((int *)local_d0._0_8_ == (int *)0x0) ||
                                                   (local_a8 != 3)) {
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar6,
                                                             "Assertion failed.");
                                                  pcVar8 = std::runtime_error::~runtime_error;
                                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001a51a1:
                                                  __cxa_throw(plVar6,puVar10,pcVar8);
                                                }
                                                sVar4 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  strides((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_d0,0);
                                                sVar5 = andres::
                                                  View<int,_false,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            ((
                                                  View<int,_false,_std::allocator<unsigned_long>_> *
                                                  )local_d0,3,sVar12,(int)local_90);
                                                if (*(int *)(uVar1 + (sVar4 * lVar13 + sVar5) * 4)
                                                    != piVar11[iVar7 + lVar13]) {
                                                  plVar6 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar6,"test failed.");
                                                  pcVar8 = std::logic_error::~logic_error;
                                                  puVar10 = &std::logic_error::typeinfo;
                                                  goto LAB_001a51a1;
                                                }
                                                lVar13 = lVar13 + 1;
                                              } while (lVar13 == 1);
                                              sVar12 = sVar12 + 1;
                                            } while (sVar12 != 3);
                                            iVar7 = (int)local_90;
                                            local_90 = (unsigned_long *)(ulong)(iVar7 + 1);
                                            if (iVar7 != 0) {
                                              operator_delete(local_c0,local_a8 * 0x18);
                                              operator_delete(local_40,0x30);
                                              return;
                                            }
                                          } while( true );
                                        }
                                      }
                                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar6,"test failed.");
                                      pcVar8 = std::logic_error::~logic_error;
                                      puVar10 = &std::logic_error::typeinfo;
LAB_001a59fd:
                                      __cxa_throw(plVar6,puVar10,pcVar8);
                                    }
                                  }
                                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar6,"test failed.");
                                  pcVar8 = std::logic_error::~logic_error;
                                  puVar10 = &std::logic_error::typeinfo;
LAB_001a59cb:
                                  __cxa_throw(plVar6,puVar10,pcVar8);
                                }
                              }
                              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar6,"test failed.");
                              pcVar8 = std::logic_error::~logic_error;
                              puVar10 = &std::logic_error::typeinfo;
LAB_001a5999:
                              __cxa_throw(plVar6,puVar10,pcVar8);
                            }
                          }
                          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::logic_error::logic_error(plVar6,"test failed.");
                          pcVar8 = std::logic_error::~logic_error;
                          puVar10 = &std::logic_error::typeinfo;
LAB_001a5935:
                          __cxa_throw(plVar6,puVar10,pcVar8);
                        }
                      }
                      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar6,"test failed.");
                      pcVar8 = std::logic_error::~logic_error;
                      puVar10 = &std::logic_error::typeinfo;
LAB_001a5903:
                      __cxa_throw(plVar6,puVar10,pcVar8);
                    }
                  }
                  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar6,"test failed.");
                  pcVar8 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
LAB_001a589f:
                  __cxa_throw(plVar6,puVar10,pcVar8);
                }
              }
              plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar6,"test failed.");
              pcVar8 = std::logic_error::~logic_error;
              puVar10 = &std::logic_error::typeinfo;
LAB_001a586d:
              __cxa_throw(plVar6,puVar10,pcVar8);
            }
          }
          plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar6,"test failed.");
          pcVar8 = std::logic_error::~logic_error;
          puVar10 = &std::logic_error::typeinfo;
LAB_001a583b:
          __cxa_throw(plVar6,puVar10,pcVar8);
        }
      }
      plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar6,"test failed.");
      pcVar8 = std::logic_error::~logic_error;
      puVar10 = &std::logic_error::typeinfo;
LAB_001a5809:
      __cxa_throw(plVar6,puVar10,pcVar8);
    }
  }
  plVar6 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar6,"test failed.");
  pcVar8 = std::logic_error::~logic_error;
  puVar10 = &std::logic_error::typeinfo;
LAB_001a57d7:
  __cxa_throw(plVar6,puVar10,pcVar8);
}

Assistant:

void ViewTest::coordinateBindingTest() {
    // 1D
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,7);
            test(w.dimension()==0 && w.size()==1);
            test(w(0)==7);
        }
    }
    // 2D with... 
    {
        // bind(0,x)
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,3);
            test(w.dimension()==1 && w.size()==4);
            test(w(0)==3 && w(1)==9 && w(2)==15 && w(3)==21);
        }
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(0,3);
            
            test(w.dimension()==1 && w.size()==4);
            test(w(0)==12 && w(1)==13 && w(2)==14 && w(3)==15);
        }
        // bind(1,x)
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.dimension()==1 && w.size()==6);
            int i = 12; 
            for(int x = 0; x < 6; ++x){
                test(w(x) == data_[i]);
                ++i;
            }
        }
        {
            int list[] = {2, 6, 10, 14, 18, 22};
            std::vector<std::size_t> shape(2); 
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.dimension()==1 && w.size()==6);
            for(int x = 0; x < 6; ++x){
                test(w(x) == list[x]);
            }
        }
    }
    // 3D with...
    {
        // bind(0,x)
        {
            int list[] = {2, 5, 8, 11, 14, 17, 20, 23};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(0,2);
        
            test(w.size()==8 && w.dimension()==2);
            int index = 0; 
                for(int y = 0; y < 2; ++y)
                for(int x = 0; x < 4; ++x){
                    test(w(x, y) == list[index]);
                    ++index;
                }
        }
        {
            int list[] = {16, 18, 20, 22, 17, 19, 21, 23};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(0,2);
            
            test(w.size()==8 && w.dimension()==2);
            int index = 0; 
                for(int y = 0; y < 2; ++y)
                for(int x = 0; x < 4; ++x){
                    test(w(x, y) == list[index]);
                    ++index;
                }
        }
        // bind(1,x)
        {
            int list[] = {6, 7, 8, 18, 19, 20};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            andres::View<int, constTarget> w = v.boundView(1,2);
            
            test(w.size()==6 && w.dimension()==2);
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(w(x, y) == list[index]);
                ++index;
            }
        }
        {
            int list[] = {4, 12, 20, 5, 13, 21};
            std::vector<std::size_t> shape(3); 
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            andres::View<int, constTarget> w = v.boundView(1,2);

            test(w.size()==6 && w.dimension()==2);
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(w(x, y) == list[index]);
                ++index;
            }
        }
    }
    // squeeze with...
    {
        // 2D to scalar 
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 1;
            shape[1] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();
            
            test(v.size()==1 && v.dimension()==0);
            test(v(0)==0);
        }
        // 2D to 1D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 24;
            shape[1] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()== 24 && v.dimension()==1);
            for(int i = 0; i < 24; ++i)
                test(v(i)==data_[i]);
        }
        // 3D to scalar 
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 1;
            shape[2] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==1 && v.dimension()==0);
            test(v(0)==0);
        } 
        // 3D to 1D with squeeze
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 24;
            shape[2] = 1;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==24 && v.dimension()==1
            );
            for(int i = 0; i < 24; ++i)
                test(v(i)==data_[i]);
        } 
        // 3D to 2D
        {
            std::vector<std::size_t> shape(3); 
            shape[0] = 1;
            shape[1] = 3;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==6 && v.dimension()==2
            );
            int i = 0; 
            for(int y = 0; y < 2; ++y){
                for(int x = 0; x < 3; ++x){
                    test(v(x, y) == data_[i]);
                    ++i;
                }
            }
        }
        // 6D to 3D
        {
            std::vector<std::size_t> shape(6);
            shape[0] = 1;
            shape[1] = 2;
            shape[2] = 1;
            shape[3] = 1;
            shape[4] = 3;
            shape[5] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.squeeze();

            test(v.size()==12 && v.dimension()==3
            );
            int i = 0; 
            for(int z = 0; z < 2; ++z){
                for(int y = 0; y < 3; ++y){
                    for(int x = 0; x < 2; ++x){
                        test(v(x, y, z) == data_[i]);
                        ++i;
                    }
                }
            }
        }
    }
}